

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O2

char * lua_getlocal(lua_State *L,lua_Debug *ar,int n)

{
  ushort uVar1;
  int iVar2;
  StkId pTVar3;
  GCObject *pGVar4;
  lua_CFunction p_Var5;
  int *piVar6;
  char *pcVar7;
  ravi_type_map type;
  StkId pos;
  TString *usertype;
  ravi_type_map local_2c;
  StkId local_28;
  TString *local_20;
  
  iVar2 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar2 + 1;
  if (iVar2 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                  ,0xb8,"const char *lua_getlocal(lua_State *, const lua_Debug *, int)");
  }
  swapextra(L);
  if (ar == (lua_Debug *)0x0) {
    if (L->top[-1].tt_ == 0x8006) {
      p_Var5 = L->top[-1].value_.f;
      if (p_Var5[8] != (_func_int_lua_State_ptr)0x6) {
        __assert_fail("(((L->top - 1)->value_).gc)->tt == ((6) | ((0) << 4))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                      ,0xbe,"const char *lua_getlocal(lua_State *, const lua_Debug *, int)");
      }
      pcVar7 = luaF_getlocalname(*(Proto **)(p_Var5 + 0x18),n,0,&local_2c,&local_20);
    }
    else {
      pcVar7 = (char *)0x0;
    }
  }
  else {
    local_28 = (StkId)0x0;
    pcVar7 = findlocal(L,ar->i_ci,n,&local_28,&local_2c,&local_20);
    if (pcVar7 != (char *)0x0) {
      pTVar3 = L->top;
      pGVar4 = (local_28->value_).gc;
      (pTVar3->value_).gc = pGVar4;
      uVar1 = local_28->tt_;
      pTVar3->tt_ = uVar1;
      if (((short)uVar1 < 0) &&
         (((uVar1 & 0x7f) != (ushort)pGVar4->tt ||
          ((pGVar4->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                      ,0xc4,"const char *lua_getlocal(lua_State *, const lua_Debug *, int)");
      }
      pTVar3 = L->top;
      L->top = pTVar3 + 1;
      if (L->ci->top < pTVar3 + 1) {
        __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                      ,0xc5,"const char *lua_getlocal(lua_State *, const lua_Debug *, int)");
      }
    }
  }
  swapextra(L);
  piVar6 = *(int **)&L[-1].hookmask;
  *piVar6 = *piVar6 + -1;
  if (*piVar6 == 0) {
    return pcVar7;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                ,0xc9,"const char *lua_getlocal(lua_State *, const lua_Debug *, int)");
}

Assistant:

LUA_API const char *lua_getlocal (lua_State *L, const lua_Debug *ar, int n) {
  const char *name;
  ravi_type_map type;
  TString *usertype;
  lua_lock(L);
  swapextra(L);
  if (ar == NULL) {  /* information about non-active function? */
    if (!isLfunction(L->top - 1))  /* not a Lua function? */
      name = NULL;
    else  /* consider live variables at function start (parameters) */
      name = luaF_getlocalname(clLvalue(L->top - 1)->p, n, 0, &type, &usertype);
  }
  else {  /* active function; get information through 'ar' */
    StkId pos = NULL;  /* to avoid warnings */
    name = findlocal(L, ar->i_ci, n, &pos, &type, &usertype);
    if (name) {
      setobj2s(L, L->top, pos);
      api_incr_top(L);
    }
  }
  swapextra(L);
  lua_unlock(L);
  return name;
}